

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::_copy_hierarchy(Tree *this,size_t dst_,size_t src_)

{
  NodeData *pNVar1;
  ulong uVar2;
  code *pcVar3;
  size_t sVar4;
  bool bVar5;
  ulong uVar6;
  NodeData *pNVar7;
  NodeData *pNVar8;
  
  uVar6 = this->m_cap;
  if (src_ == 0xffffffffffffffff || uVar6 <= src_) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    (*(code *)PTR_error_impl_00247a78)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    uVar6 = this->m_cap;
  }
  pNVar1 = this->m_buf;
  pNVar8 = pNVar1;
  if (dst_ == 0xffffffffffffffff || uVar6 <= dst_) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    (*(code *)PTR_error_impl_00247a78)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pNVar8 = this->m_buf;
    uVar6 = this->m_cap;
  }
  uVar2 = pNVar1[src_].m_parent;
  if ((uVar2 == 0xffffffffffffffff) || (pNVar7 = pNVar8, uVar6 <= uVar2)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    (*(code *)PTR_error_impl_00247a78)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pNVar7 = this->m_buf;
  }
  for (uVar6 = pNVar1[src_].m_first_child; uVar6 != 0xffffffffffffffff;
      uVar6 = next_sibling(this,uVar6)) {
    if (this->m_cap <= uVar6) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    this->m_buf[uVar6].m_parent = dst_;
  }
  uVar6 = pNVar1[src_].m_prev_sibling;
  if (uVar6 != 0xffffffffffffffff) {
    if (this->m_cap <= uVar6) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    this->m_buf[uVar6].m_next_sibling = dst_;
  }
  uVar6 = pNVar1[src_].m_next_sibling;
  if (uVar6 != 0xffffffffffffffff) {
    if (this->m_cap <= uVar6) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    this->m_buf[uVar6].m_prev_sibling = dst_;
  }
  if (pNVar7[uVar2].m_first_child == src_) {
    pNVar7[uVar2].m_first_child = dst_;
  }
  if (pNVar7[uVar2].m_last_child == src_) {
    pNVar7[uVar2].m_last_child = dst_;
  }
  sVar4 = pNVar1[src_].m_first_child;
  pNVar8[dst_].m_parent = pNVar1[src_].m_parent;
  (&pNVar8[dst_].m_parent)[1] = sVar4;
  pNVar8[dst_].m_prev_sibling = pNVar1[src_].m_prev_sibling;
  sVar4 = pNVar1[src_].m_next_sibling;
  pNVar8[dst_].m_last_child = pNVar1[src_].m_last_child;
  (&pNVar8[dst_].m_last_child)[1] = sVar4;
  return;
}

Assistant:

void Tree::_copy_hierarchy(size_t dst_, size_t src_)
{
    auto const& C4_RESTRICT src = *_p(src_);
    auto      & C4_RESTRICT dst = *_p(dst_);
    auto      & C4_RESTRICT prt = *_p(src.m_parent);
    for(size_t i = src.m_first_child; i != NONE; i = next_sibling(i))
    {
        _p(i)->m_parent = dst_;
    }
    if(src.m_prev_sibling != NONE)
    {
        _p(src.m_prev_sibling)->m_next_sibling = dst_;
    }
    if(src.m_next_sibling != NONE)
    {
        _p(src.m_next_sibling)->m_prev_sibling = dst_;
    }
    if(prt.m_first_child == src_)
    {
        prt.m_first_child = dst_;
    }
    if(prt.m_last_child  == src_)
    {
        prt.m_last_child  = dst_;
    }
    dst.m_parent       = src.m_parent;
    dst.m_first_child  = src.m_first_child;
    dst.m_last_child   = src.m_last_child;
    dst.m_prev_sibling = src.m_prev_sibling;
    dst.m_next_sibling = src.m_next_sibling;
}